

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Request_get_status(MPIABI_Request request,int *flag,MPIABI_Status *status)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Request_get_status();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Request_get_status(
  MPIABI_Request request,
  int * flag,
  MPIABI_Status * status
) {
  return MPI_Request_get_status(
    (MPI_Request)(WPI_Request)request,
    flag,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}